

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildStartCall(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  OpLayoutStartCall *pOVar5;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  undefined6 in_register_00000032;
  Instr *local_38;
  Instr *instr;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17e2,"(newOpcode == Js::OpCode::StartCall)",
                       "newOpcode == Js::OpCode::StartCall");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pOVar5 = Js::ByteCodeReader::StartCall(&this->m_jnReader);
  uVar1 = pOVar5->ArgCount;
  dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
  this->m_callsOnStack = this->m_callsOnStack + 1;
  src1Opnd = IR::IntConstOpnd::New((ulong)uVar1,TyInt32,this->m_func,false);
  local_38 = IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this,local_38,offset);
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this->m_argStack,&local_38);
  return;
}

Assistant:

void
IRBuilder::BuildStartCall(Js::OpCode newOpcode, uint32 offset)
{
    Assert(newOpcode == Js::OpCode::StartCall);

    const unaligned Js::OpLayoutStartCall * regLayout = m_jnReader.StartCall();
    Js::ArgSlot ArgCount = regLayout->ArgCount;

    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;

    // Dst of StartCall is always r0...  Let's give it a new dst such that it can
    // be singleDef.

    dstOpnd = IR::RegOpnd::New(TyVar, m_func);

#if DBG
    m_callsOnStack++;
#endif

    IntConstType    value = ArgCount;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    // Keep a stack of arg instructions such that we can link them up once we see
    // the call that consumes them.

    m_argStack->Push(instr);
}